

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_base.h
# Opt level: O1

bool __thiscall
LineBase2D<float>::intersection
          (LineBase2D<float> *this,LineBase2D<float> *line,PointBase2D<float> *point)

{
  PointBase2D<float> PVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float denominator;
  float local_20;
  float local_1c;
  
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)((line->_direction).y * (this->_direction).x)),
                           ZEXT416((uint)(this->_direction).y),ZEXT416((uint)(line->_direction).x));
  local_20 = auVar3._0_4_;
  local_1c = 0.0;
  bVar2 = pvmath::isEqual<float>(&local_20,&local_1c,10.0);
  if (!bVar2) {
    PVar1 = this->_position;
    auVar3._8_8_ = 0;
    auVar3._0_4_ = PVar1.x;
    auVar3._4_4_ = PVar1.y;
    auVar3 = vmovshdup_avx(auVar3);
    auVar3 = vfmsub231ss_fma(ZEXT416((uint)((auVar3._0_4_ - (line->_position).y) *
                                           (line->_direction).x)),
                             ZEXT416((uint)(PVar1.x - (line->_position).x)),
                             ZEXT416((uint)(line->_direction).y));
    local_20 = auVar3._0_4_ / local_20;
    auVar4._0_4_ = PVar1.x + (this->_direction).x * local_20;
    auVar4._4_4_ = PVar1.y + (this->_direction).y * local_20;
    auVar4._8_4_ = local_20 * 0.0 + 0.0;
    auVar4._12_4_ = local_20 * 0.0 + 0.0;
    PVar1 = (PointBase2D<float>)vmovlps_avx(auVar4);
    *point = PVar1;
  }
  return !bVar2;
}

Assistant:

bool intersection( const LineBase2D & line, PointBase2D<_Type> & point ) const
    {
        // based on Graphics Gems III, Faster Line Segment Intersection, p. 199-202
        // http://www.realtimerendering.com/resources/GraphicsGems/gems.html#gemsiii
        const _Type denominator = _direction.y * line._direction.x - _direction.x * line._direction.y;
        if ( pvmath::isEqual<_Type>( denominator, 0, 10 ) )
            return false; // they are parallel

        const PointBase2D<_Type> offset = _position - line._position;
        const _Type na = (line._direction.y * offset.x - line._direction.x * offset.y) / denominator;
        point = _position + PointBase2D<_Type>( _direction.x * na, _direction.y * na );
        return true;
    }